

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

UBool __thiscall icu_63::MeasureUnit::operator==(MeasureUnit *this,UObject *other)

{
  bool bVar1;
  int iVar2;
  
  if (this != (MeasureUnit *)other) {
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                       (type_info *)other->_vptr_UObject[-1]);
    if (((bVar1) || (this->fTypeId != *(int *)&other[1]._vptr_UObject)) ||
       (this->fSubTypeId != *(int *)((long)&other[1]._vptr_UObject + 4))) {
      bVar1 = false;
    }
    else {
      iVar2 = strcmp(this->fCurrency,(char *)(other + 2));
      bVar1 = iVar2 == 0;
    }
    return bVar1;
  }
  return '\x01';
}

Assistant:

UBool MeasureUnit::operator==(const UObject& other) const {
    if (this == &other) {  // Same object, equal
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) { // Different types, not equal
        return FALSE;
    }
    const MeasureUnit &rhs = static_cast<const MeasureUnit&>(other);
    return (
            fTypeId == rhs.fTypeId
            && fSubTypeId == rhs.fSubTypeId
            && uprv_strcmp(fCurrency, rhs.fCurrency) == 0);
}